

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

Value * duckdb::HomeDirectorySetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  ClientConfig *pCVar1;
  string local_30;
  
  pCVar1 = ClientConfig::GetConfig(context);
  ::std::__cxx11::string::string((string *)&local_30,(string *)pCVar1);
  Value::Value(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Value HomeDirectorySetting::GetSetting(const ClientContext &context) {
	auto &config = ClientConfig::GetConfig(context);
	return Value(config.home_directory);
}